

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

string * __thiscall
libcellml::Generator::GeneratorImpl::newLineIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorImpl *this)

{
  char cVar1;
  char *__s;
  allocator<char> local_19;
  GeneratorImpl *local_18;
  GeneratorImpl *this_local;
  
  local_18 = this;
  this_local = (GeneratorImpl *)__return_storage_ptr__;
  cVar1 = std::__cxx11::string::empty();
  __s = "\n";
  if (cVar1 != '\0') {
    __s = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_19)
  ;
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::GeneratorImpl::newLineIfNeeded()
{
    return mCode.empty() ? "" : "\n";
}